

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

bool leveldb::ParseFileName(string *filename,uint64_t *number,FileType *type)

{
  bool bVar1;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  Slice suffix;
  uint64_t num_1;
  uint64_t num;
  Slice rest;
  uint6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  bool bVar2;
  undefined1 in_stack_ffffffffffffff1f;
  undefined1 uVar3;
  Slice *in_stack_ffffffffffffff20;
  Slice *in_stack_ffffffffffffff28;
  Slice *in_stack_ffffffffffffff30;
  Slice *in_stack_ffffffffffffff38;
  Slice *in_stack_ffffffffffffff40;
  uint64_t *in_stack_ffffffffffffff60;
  Slice *in_stack_ffffffffffffff68;
  undefined8 local_90;
  undefined8 local_88;
  Slice local_30;
  undefined4 *local_20;
  undefined8 *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  Slice::Slice(in_stack_ffffffffffffff20,
               (string *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
  Slice::Slice(in_stack_ffffffffffffff20,
               (char *)CONCAT17(in_stack_ffffffffffffff1f,
                                CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
  bVar1 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar1) {
    *local_18 = 0;
    *local_20 = 4;
  }
  else {
    Slice::Slice(in_stack_ffffffffffffff20,
                 (char *)CONCAT17(in_stack_ffffffffffffff1f,
                                  CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
    bVar1 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) {
      *local_18 = 0;
      *local_20 = 1;
    }
    else {
      Slice::Slice(in_stack_ffffffffffffff20,
                   (char *)CONCAT17(in_stack_ffffffffffffff1f,
                                    CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
      bVar1 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      uVar3 = true;
      if (!bVar1) {
        Slice::Slice(in_stack_ffffffffffffff20,
                     (char *)CONCAT17(1,CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18
                                                )));
        uVar3 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      if ((bool)uVar3 == false) {
        Slice::Slice(in_stack_ffffffffffffff20,
                     (char *)(ulong)CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18));
        bVar1 = Slice::starts_with(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if (bVar1) {
          Slice::remove_prefix(&local_30,9);
          bVar1 = ConsumeDecimalNumber(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          if (!bVar1) {
            return false;
          }
          bVar1 = Slice::empty(&local_30);
          if (!bVar1) {
            return false;
          }
          *local_20 = 3;
          *local_18 = local_88;
        }
        else {
          bVar1 = ConsumeDecimalNumber(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
          if (!bVar1) {
            return false;
          }
          Slice::Slice(in_stack_ffffffffffffff20,
                       (char *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff1e,
                                                       in_stack_ffffffffffffff18)));
          bVar1 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          if (bVar1) {
            *local_20 = 0;
          }
          else {
            Slice::Slice(in_stack_ffffffffffffff20,
                         (char *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff1e,
                                                         in_stack_ffffffffffffff18)));
            bVar1 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            bVar2 = true;
            if (!bVar1) {
              Slice::Slice(in_stack_ffffffffffffff20,
                           (char *)CONCAT17(uVar3,CONCAT16(1,in_stack_ffffffffffffff18)));
              bVar2 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            }
            if (bVar2 == false) {
              Slice::Slice(in_stack_ffffffffffffff20,
                           (char *)CONCAT17(uVar3,(uint7)in_stack_ffffffffffffff18));
              bVar1 = operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
              if (!bVar1) {
                return false;
              }
              *local_20 = 5;
            }
            else {
              *local_20 = 2;
            }
          }
          *local_18 = local_90;
        }
      }
      else {
        *local_18 = 0;
        *local_20 = 6;
      }
    }
  }
  return true;
}

Assistant:

bool ParseFileName(const std::string& filename, uint64_t* number,
                   FileType* type) {
  Slice rest(filename);
  if (rest == "CURRENT") {
    *number = 0;
    *type = kCurrentFile;
  } else if (rest == "LOCK") {
    *number = 0;
    *type = kDBLockFile;
  } else if (rest == "LOG" || rest == "LOG.old") {
    *number = 0;
    *type = kInfoLogFile;
  } else if (rest.starts_with("MANIFEST-")) {
    rest.remove_prefix(strlen("MANIFEST-"));
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    if (!rest.empty()) {
      return false;
    }
    *type = kDescriptorFile;
    *number = num;
  } else {
    // Avoid strtoull() to keep filename format independent of the
    // current locale
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    Slice suffix = rest;
    if (suffix == Slice(".log")) {
      *type = kLogFile;
    } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
      *type = kTableFile;
    } else if (suffix == Slice(".dbtmp")) {
      *type = kTempFile;
    } else {
      return false;
    }
    *number = num;
  }
  return true;
}